

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_NVector_MultiFab.cpp
# Opt level: O1

void N_VScale_MultiFab(Real c,N_Vector x,N_Vector z)

{
  int numcomp;
  MultiFab *src;
  MultiFab *dst;
  
  src = *(MultiFab **)((long)x->content + 8);
  dst = *(MultiFab **)((long)z->content + 8);
  numcomp = (src->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp;
  amrex::MultiFab::Copy(dst,src,0,0,numcomp,0);
  amrex::MultiFab::mult(dst,c,0,numcomp,0);
  return;
}

Assistant:

void N_VScale_MultiFab(amrex::Real c, N_Vector x, N_Vector z)
{
    amrex::MultiFab *mf_x = amrex::sundials::getMFptr(x);
    amrex::MultiFab *mf_z = amrex::sundials::getMFptr(z);

    sunindextype ncomp = mf_x->nComp();
    //sunindextype nghost = mf_x->nGrow();
    sunindextype nghost = 0;  // do not include ghost cells

    amrex::MultiFab::Copy(*mf_z, *mf_x, 0, 0, ncomp, nghost);
    mf_z->mult(c, 0, ncomp, nghost);
}